

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

int __thiscall Fl_Window::handle(Fl_Window *this,int ev)

{
  int iVar1;
  Fl_X *xTemp;
  Fl_Group *pFVar2;
  Fl_X *xTemp_1;
  
  pFVar2 = (this->super_Fl_Group).super_Fl_Widget.parent_;
  if (pFVar2 != (Fl_Group *)0x0) {
    if (ev == 0xf) {
      if (this->i != (Fl_X *)0x0) {
        if (((this->super_Fl_Group).super_Fl_Widget.flags_ & 2) == 0) {
          while (((pFVar2->super_Fl_Widget).flags_ & 2) == 0) {
            pFVar2 = (pFVar2->super_Fl_Widget).parent_;
          }
          if (0xef < (pFVar2->super_Fl_Widget).type_) goto LAB_001a3f56;
        }
        XUnmapWindow(fl_display,this->i->xid);
      }
    }
    else if (ev == 0x10) {
      if (this->i == (Fl_X *)0x0) {
        (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this);
      }
      else {
        XMapWindow(fl_display,this->i->xid);
      }
    }
  }
LAB_001a3f56:
  iVar1 = Fl_Group::handle(&this->super_Fl_Group,ev);
  return iVar1;
}

Assistant:

int Fl_Window::handle(int ev)
{
  if (parent()) {
    switch (ev) {
    case FL_SHOW:
      if (!shown()) show();
      else {
#if defined(USE_X11) || defined(WIN32)
        XMapWindow(fl_display, fl_xid(this)); // extra map calls are harmless
#elif defined(__APPLE_QUARTZ__)
	i->map();
#else
# error unsupported platform
#endif // __APPLE__
      }
      break;
    case FL_HIDE:
      if (shown()) {
	// Find what really turned invisible, if it was a parent window
	// we do nothing.  We need to avoid unnecessary unmap calls
	// because they cause the display to blink when the parent is
	// remapped.  However if this or any intermediate non-window
	// widget has really had hide() called directly on it, we must
	// unmap because when the parent window is remapped we don't
	// want to reappear.
	if (visible()) {
	 Fl_Widget* p = parent(); for (;p->visible();p = p->parent()) {}
	 if (p->type() >= FL_WINDOW) break; // don't do the unmap
	}
#if defined(USE_X11) || defined(WIN32)
	XUnmapWindow(fl_display, fl_xid(this));
#elif defined(__APPLE_QUARTZ__)
	i->unmap();
#else
# error platform unsupported
#endif
      }
      break;
    }
//  } else if (ev == FL_FOCUS || ev == FL_UNFOCUS) {
//    Fl_Tooltip::exit(Fl_Tooltip::current());
  }

  return Fl_Group::handle(ev);
}